

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

int IDAQuadSensSVtolerances(void *ida_mem,sunrealtype reltolQS,N_Vector *abstolQS)

{
  double *pdVar1;
  int iVar2;
  void *__ptr;
  N_Vector *pp_Var3;
  int *piVar4;
  undefined8 *in_RSI;
  IDAMem in_RDI;
  double in_XMM0_Qa;
  undefined8 uVar5;
  sunrealtype *atolmin;
  int retval;
  int is;
  IDAMem IDA_mem;
  int local_2c;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x839,"IDAQuadSensSVtolerances",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDI->ida_sensi == 0) {
    IDAProcessError(in_RDI,-0x28,0x841,"IDAQuadSensSVtolerances",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                    ,"Illegal attempt to call before calling IDASensInit.");
    local_4 = -0x28;
  }
  else if (in_RDI->ida_quadSensMallocDone == 0) {
    IDAProcessError(in_RDI,-0x32,0x849,"IDAQuadSensSVtolerances",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                    ,"Forward sensitivity analysis for quadrature variables was not activated.");
    local_4 = -0x32;
  }
  else if (0.0 <= in_XMM0_Qa) {
    if (in_RSI == (undefined8 *)0x0) {
      IDAProcessError(in_RDI,-0x16,0x859,"IDAQuadSensSVtolerances",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                      ,"abstolQS = NULL illegal parameter.");
      local_4 = -0x16;
    }
    else {
      __ptr = malloc((long)in_RDI->ida_Ns << 3);
      for (local_2c = 0; local_2c < in_RDI->ida_Ns; local_2c = local_2c + 1) {
        uVar5 = N_VMin(in_RSI[local_2c]);
        *(undefined8 *)((long)__ptr + (long)local_2c * 8) = uVar5;
        pdVar1 = (double *)((long)__ptr + (long)local_2c * 8);
        if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
          IDAProcessError(in_RDI,-0x16,0x864,"IDAQuadSensSVtolerances",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                          ,"abstolQS has negative component(s) (illegal).");
          free(__ptr);
          return -0x16;
        }
      }
      in_RDI->ida_itolQS = 2;
      in_RDI->ida_rtolQS = in_XMM0_Qa;
      if (in_RDI->ida_VatolQSMallocDone == 0) {
        pp_Var3 = (N_Vector *)N_VCloneVectorArray(in_RDI->ida_Ns,*in_RSI);
        in_RDI->ida_VatolQS = pp_Var3;
        piVar4 = (int *)malloc((long)in_RDI->ida_Ns << 2);
        in_RDI->ida_atolQSmin0 = piVar4;
        in_RDI->ida_lrw = (long)in_RDI->ida_Ns * in_RDI->ida_lrw1Q + in_RDI->ida_lrw;
        in_RDI->ida_liw = (long)in_RDI->ida_Ns * in_RDI->ida_liw1Q + in_RDI->ida_liw;
        in_RDI->ida_VatolQSMallocDone = 1;
      }
      for (local_2c = 0; local_2c < in_RDI->ida_Ns; local_2c = local_2c + 1) {
        in_RDI->ida_cvals[local_2c] = 1.0;
        in_RDI->ida_atolQSmin0[local_2c] =
             (uint)(*(double *)((long)__ptr + (long)local_2c * 8) == 0.0);
      }
      free(__ptr);
      iVar2 = N_VScaleVectorArray(in_RDI->ida_Ns,in_RDI->ida_cvals,in_RSI,in_RDI->ida_VatolQS);
      if (iVar2 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = -0x1c;
      }
    }
  }
  else {
    IDAProcessError(in_RDI,-0x16,0x852,"IDAQuadSensSVtolerances",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                    ,"reltolQS < 0 illegal parameter.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int IDAQuadSensSVtolerances(void* ida_mem, sunrealtype reltolQS,
                            N_Vector* abstolQS)
{
  IDAMem IDA_mem;
  int is, retval;
  sunrealtype* atolmin;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Check if sensitivity analysis is active */
  if (!IDA_mem->ida_sensi)
  {
    IDAProcessError(IDA_mem, IDA_NO_SENS, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    return (IDA_NO_SENS);
  }

  /* Was sensitivity for quadrature already initialized? */
  if (!IDA_mem->ida_quadSensMallocDone)
  {
    IDAProcessError(IDA_mem, IDA_NO_QUADSENS, __LINE__, __func__, __FILE__,
                    MSG_NO_QUADSENSI);
    return (IDA_NO_QUADSENS);
  }

  /* Test user-supplied tolerances */

  if (reltolQS < ZERO)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_RELTOLQS);
    return (IDA_ILL_INPUT);
  }

  if (abstolQS == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NULL_ABSTOLQS);
    return (IDA_ILL_INPUT);
  }

  atolmin = (sunrealtype*)malloc(IDA_mem->ida_Ns * sizeof(sunrealtype));
  for (is = 0; is < IDA_mem->ida_Ns; is++)
  {
    atolmin[is] = N_VMin(abstolQS[is]);
    if (atolmin[is] < ZERO)
    {
      IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_ABSTOLQS);
      free(atolmin);
      return (IDA_ILL_INPUT);
    }
  }

  /* Save data. */
  IDA_mem->ida_itolQS = IDA_SV;
  IDA_mem->ida_rtolQS = reltolQS;

  if (!(IDA_mem->ida_VatolQSMallocDone))
  {
    IDA_mem->ida_VatolQS = N_VCloneVectorArray(IDA_mem->ida_Ns, abstolQS[0]);
    IDA_mem->ida_atolQSmin0 =
      (sunbooleantype*)malloc(IDA_mem->ida_Ns * sizeof(sunbooleantype));
    IDA_mem->ida_lrw += IDA_mem->ida_Ns * IDA_mem->ida_lrw1Q;
    IDA_mem->ida_liw += IDA_mem->ida_Ns * IDA_mem->ida_liw1Q;
    IDA_mem->ida_VatolQSMallocDone = SUNTRUE;
  }

  for (is = 0; is < IDA_mem->ida_Ns; is++)
  {
    IDA_mem->ida_cvals[is]      = ONE;
    IDA_mem->ida_atolQSmin0[is] = (atolmin[is] == ZERO);
  }
  free(atolmin);

  retval = N_VScaleVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_cvals, abstolQS,
                               IDA_mem->ida_VatolQS);
  if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

  return (IDA_SUCCESS);
}